

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O3

bool __thiscall wasm::WasmValidator::validate(WasmValidator *this,Module *module,Flags flags)

{
  Name *pNVar1;
  ExternalKind EVar2;
  tuple<wasm::Function_*,_std::default_delete<wasm::Function>_> func;
  pointer puVar3;
  Export *pEVar4;
  Expression *pEVar5;
  uintptr_t uVar6;
  long *plVar7;
  Global *pGVar8;
  DataSegment *pDVar9;
  pointer pcVar10;
  long lVar11;
  __buckets_ptr pp_Var12;
  ElementSegment *pEVar13;
  pointer ppEVar14;
  pointer puVar15;
  pointer puVar16;
  pointer puVar17;
  pointer puVar18;
  Name NVar19;
  iterator iVar20;
  bool bVar21;
  FeatureSet FVar22;
  uint uVar23;
  int iVar24;
  Type *pTVar25;
  Type *pTVar26;
  Tuple *pTVar27;
  Function *pFVar28;
  size_type sVar29;
  ostringstream *this_00;
  ostream *poVar30;
  Global *pGVar31;
  Memory *pMVar32;
  Table *pTVar33;
  const_iterator cVar34;
  iterator iVar35;
  __hash_code __code;
  char *pcVar36;
  ulong uVar37;
  pointer puVar38;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *puVar39;
  byte bVar40;
  iterator __begin2_1;
  pointer puVar41;
  pointer puVar42;
  Type TVar43;
  pointer puVar44;
  iterator iVar45;
  pointer ppEVar46;
  pointer puVar47;
  iterator __end2_1;
  pointer puVar48;
  pointer puVar49;
  Signature *this_01;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment_1;
  pointer puVar50;
  HeapType HVar51;
  pointer puVar52;
  iterator __begin2;
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var53;
  bool bVar54;
  Name name_00;
  Name name_01;
  Signature SVar55;
  Name name_02;
  PassRunner local_4a8;
  pointer local_390;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_388;
  undefined1 local_370 [8];
  Type funcref;
  undefined8 local_360;
  _Head_base<0UL,_wasm::Function_*,_false> local_350;
  HeapType type;
  Iterator __begin3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  undefined1 local_318 [184];
  pointer pTStack_260;
  __node_base local_258;
  Function *pFStack_250;
  Module *local_248;
  undefined1 *local_240;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  _Stack_238;
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_200;
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1c8;
  _Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_190;
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_158;
  Type local_120;
  Type externref;
  undefined1 local_110 [16];
  undefined1 local_100 [8];
  ValidationInfo info;
  undefined1 auStack_88 [8];
  string name;
  __node_base _Stack_58;
  Type local_50;
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_48;
  iterator __end2;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range1;
  
  info.validateWeb = false;
  info.validateGlobally = false;
  info.quiet = false;
  info.closedWorld = false;
  info.valid._M_base._M_i = (__atomic_base<bool>)0x0;
  info._13_3_ = 0;
  info.mutex.super___mutex_base._M_mutex.__align = 0;
  info.mutex.super___mutex_base._M_mutex._8_8_ = 0;
  info.mutex.super___mutex_base._M_mutex._16_8_ = 0;
  info.mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  info.mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)&info.outputs._M_h._M_rehash_policy._M_next_resize;
  info.outputs._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
  info.outputs._M_h._M_bucket_count = 0;
  info.outputs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  info.outputs._M_h._M_element_count._0_4_ = 0x3f800000;
  info.outputs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  info.outputs._M_h._M_rehash_policy._4_4_ = 0;
  info.outputs._M_h._M_rehash_policy._M_next_resize = 0;
  LOCK();
  info.wasm._4_1_ = 1;
  UNLOCK();
  bVar40 = (byte)flags;
  info.wasm._0_1_ = bVar40 & 1;
  info.wasm._1_1_ = bVar40 >> 1 & 1;
  info.wasm._2_1_ = bVar40 >> 2 & 1;
  info.wasm._3_1_ = bVar40 >> 3 & 1;
  local_4a8.options.arguments._M_h._M_buckets = &local_4a8.options.arguments._M_h._M_single_bucket;
  local_4a8._vptr_PassRunner = (_func_int **)&PTR__PassRunner_00d727e0;
  local_4a8.allocator = &module->allocator;
  local_4a8.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_4a8.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_4a8.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_4a8._41_8_ = 0;
  local_4a8.options.validate = true;
  local_4a8.options.validateGlobally = true;
  local_4a8.options.optimizeLevel = 0;
  local_4a8.options.shrinkLevel = 0;
  local_4a8.options.inlining.alwaysInlineMaxSize = 2;
  local_4a8.options.inlining.oneCallerInlineMaxSize = 0xffffffff;
  local_4a8.options.inlining.flexibleInlineMaxSize = 0x14;
  local_4a8.options.inlining.allowFunctionsWithLoops = false;
  local_4a8.options.inlining.partialInliningIfs = 0;
  local_4a8.options.ignoreImplicitTraps = false;
  local_4a8.options.trapsNeverHappen = false;
  local_4a8.options.lowMemoryUnused = false;
  local_4a8.options.fastMath = false;
  local_4a8.options.zeroFilledMemory = false;
  local_4a8.options.closedWorld = false;
  local_4a8.options.debugInfo = false;
  local_4a8.options.targetJS = false;
  local_4a8.options.arguments._M_h._M_bucket_count = 1;
  local_4a8.options.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_4a8.options.arguments._M_h._M_element_count = 0;
  local_4a8.options.arguments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_4a8.options.arguments._M_h._M_rehash_policy._M_next_resize = 0;
  local_4a8.options.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_4a8.options.passesToSkip._M_h._M_buckets =
       &local_4a8.options.passesToSkip._M_h._M_single_bucket;
  local_4a8.options.passesToSkip._M_h._M_bucket_count = 1;
  local_4a8.options.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_4a8.options.passesToSkip._M_h._M_element_count = 0;
  local_4a8.options.passesToSkip._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_4a8.skippedPasses._M_h._M_buckets = &local_4a8.skippedPasses._M_h._M_single_bucket;
  local_4a8.options.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_4a8.options.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_7_ = 0;
  local_4a8._215_4_ = 0;
  local_4a8.options.passesToSkip._M_h._M_rehash_policy._M_next_resize = 0;
  local_4a8.options.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_4a8.skippedPasses._M_h._M_bucket_count = 1;
  local_4a8.skippedPasses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_4a8.skippedPasses._M_h._M_element_count = 0;
  local_4a8.skippedPasses._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_4a8.skippedPasses._M_h._M_rehash_policy._M_next_resize = 0;
  local_4a8.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)&local_328;
  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  local_328._M_allocated_capacity._0_4_ = local_328._M_allocated_capacity._0_4_ & 0xffffff00;
  local_318._0_8_ = (__node_base_ptr)0x0;
  local_318._8_8_ = 0;
  local_318._176_8_ =
       (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        *)0x0;
  pTStack_260 = (pointer)0x0;
  local_258._M_nxt = (_Hash_node_base *)0x0;
  pFStack_250 = (Function *)0x0;
  type.id = (uintptr_t)&PTR__FunctionValidator_00d768a8;
  local_240 = local_100;
  _Stack_238._M_buckets = &_Stack_238._M_single_bucket;
  _Stack_238._M_bucket_count = (size_type)&DAT_00000001;
  _Stack_238._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  _Stack_238._M_element_count = 0;
  _Stack_238._M_rehash_policy._M_max_load_factor = 1.0;
  _Stack_238._M_rehash_policy._M_next_resize = 0;
  _Stack_238._M_single_bucket = (__node_base_ptr)0x0;
  local_200._M_buckets = &local_200._M_single_bucket;
  local_200._M_bucket_count = 1;
  local_200._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_200._M_element_count = 0;
  local_200._M_rehash_policy._M_max_load_factor = 1.0;
  local_200._M_rehash_policy._M_next_resize = 0;
  local_200._M_single_bucket = (__node_base_ptr)0x0;
  local_1c8._M_buckets = &local_1c8._M_single_bucket;
  local_1c8._M_bucket_count = 1;
  local_1c8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1c8._M_element_count = 0;
  local_1c8._M_rehash_policy._M_max_load_factor = 1.0;
  local_1c8._M_rehash_policy._M_next_resize = 0;
  local_1c8._M_single_bucket = (__node_base_ptr)0x0;
  local_190._M_buckets = &local_190._M_single_bucket;
  local_190._M_bucket_count = 1;
  local_190._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_190._M_element_count = 0;
  local_190._M_rehash_policy._M_max_load_factor = 1.0;
  local_190._M_rehash_policy._M_next_resize = 0;
  local_190._M_single_bucket = (__node_base_ptr)0x0;
  local_158._M_buckets = &local_158._M_single_bucket;
  local_158._M_bucket_count = 1;
  local_158._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_158._M_element_count = 0;
  local_158._M_rehash_policy._M_max_load_factor = 1.0;
  local_158._M_rehash_policy._M_next_resize = 0;
  local_158._M_single_bucket = (__node_base_ptr)0x0;
  local_4a8.wasm = module;
  local_248 = module;
  local_100 = (undefined1  [8])module;
  WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
  ::run((WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
         *)&type,&local_4a8,module);
  local_50.id = (uintptr_t)&PTR__FunctionValidator_00d768a8;
  type.id = (uintptr_t)&PTR__FunctionValidator_00d768a8;
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_158);
  std::
  _Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_190);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_1c8);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_200);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&_Stack_238);
  if ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)local_318._176_8_ !=
      (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)0x0) {
    operator_delete((void *)local_318._176_8_,(long)local_258._M_nxt - local_318._176_8_);
  }
  info.outputs._M_h._M_single_bucket = (__node_base_ptr)&PTR__Pass_00d722d8;
  type.id = (uintptr_t)&PTR__Pass_00d722d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index !=
      &local_328) {
    operator_delete((void *)__begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index,
                    CONCAT44(local_328._M_allocated_capacity._4_4_,
                             local_328._M_allocated_capacity._0_4_) + 1);
  }
  if (info.wasm._1_1_ == 1) {
    p_Var53 = (_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)(module->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    local_48 = (_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(module->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    if (p_Var53 != local_48) {
      do {
        func.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
             (((__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> *)
              &p_Var53->_M_buckets)->
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>;
        if (*(char **)((long)func.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20) !=
            (char *)0x0) {
          __end2._M_current =
               (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
               ((long)func.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x38);
          SVar55 = HeapType::getSignature((HeapType *)__end2._M_current);
          type.id = (uintptr_t)SVar55.results.id;
          bVar21 = wasm::Type::isTuple((Type *)&type);
          if (bVar21) {
            ValidationInfo::shouldBeTrue<wasm::Name>
                      ((ValidationInfo *)local_100,
                       (bool)((byte)((module->features).features >> 9) & 1),
                       (IString)*(IString *)
                                 func.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                       "Imported multivalue function requires multivalue [--enable-multivalue]",
                       (Function *)0x0);
          }
          if ((byte)info.wasm == 1) {
            SVar55 = HeapType::getSignature((HeapType *)__end2._M_current);
            auStack_88 = (undefined1  [8])SVar55.params.id;
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)0x0;
            type.id = (uintptr_t)auStack_88;
            pTVar25 = (Type *)wasm::Type::size((Type *)auStack_88);
            if (pTVar25 != (Type *)0x0) {
              do {
                do {
                  pTVar26 = wasm::Type::Iterator::operator*((Iterator *)&type);
                  ValidationInfo::shouldBeUnequal<wasm::Name,wasm::Type>
                            ((ValidationInfo *)local_100,(Type)pTVar26->id,(Type)0x3,
                             (IString)*(IString *)
                                       func.
                                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                             "Imported function must not have i64 parameters",(Function *)0x0);
                  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                  parent = (Type *)((long)&(__begin3.
                                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                           .parent)->id + 1);
                } while (__begin3.
                         super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                         != pTVar25);
              } while ((Type *)type.id != (Type *)auStack_88);
            }
            SVar55 = HeapType::getSignature((HeapType *)__end2._M_current);
            auStack_88 = (undefined1  [8])SVar55.results.id;
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)0x0;
            type.id = (uintptr_t)auStack_88;
            pTVar25 = (Type *)wasm::Type::size((Type *)auStack_88);
            if (pTVar25 != (Type *)0x0) {
              do {
                do {
                  pTVar26 = wasm::Type::Iterator::operator*((Iterator *)&type);
                  ValidationInfo::shouldBeUnequal<wasm::Name,wasm::Type>
                            ((ValidationInfo *)local_100,(Type)pTVar26->id,(Type)0x3,
                             (IString)*(IString *)
                                       func.
                                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                             "Imported function must not have i64 results",(Function *)0x0);
                  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                  parent = (Type *)((long)&(__begin3.
                                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                           .parent)->id + 1);
                } while (__begin3.
                         super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                         != pTVar25);
              } while ((Type *)type.id != (Type *)auStack_88);
            }
          }
          type.id = (uintptr_t)module;
          bVar21 = Intrinsics::isCallWithoutEffects
                             ((Intrinsics *)&type,
                              (Function *)
                              func.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
          if (bVar21) {
            SVar55 = HeapType::getSignature((HeapType *)__end2._M_current);
            type.id = (uintptr_t)SVar55.params.id;
            bVar21 = wasm::Type::isTuple((Type *)&type);
            if (bVar21) {
              pTVar27 = wasm::Type::getTuple((Type *)&type);
              type.id = (pTVar27->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].id;
            }
            bVar21 = wasm::Type::isFunction((Type *)&type);
            ValidationInfo::shouldBeTrue<wasm::Name>
                      ((ValidationInfo *)local_100,bVar21,
                       (IString)*(IString *)
                                 func.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                       "call.if.used\'s last param must be a function",(Function *)0x0);
          }
        }
        p_Var53 = (_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&p_Var53->_M_bucket_count;
      } while (p_Var53 != local_48);
    }
    puVar41 = (module->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (module->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar41 != puVar3) {
      do {
        pGVar31 = (puVar41->_M_t).
                  super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar31->super_Importable).module + 8) != (char *)0x0) {
          if (((module->features).features & 2) == 0) {
            ValidationInfo::shouldBeFalse<wasm::Name>
                      ((ValidationInfo *)local_100,pGVar31->mutable_,
                       (IString)*(IString *)&(pGVar31->super_Importable).super_Named,
                       "Imported mutable global requires mutable-globals [--enable-mutable-globals]"
                       ,(Function *)0x0);
          }
          bVar21 = wasm::Type::isTuple(&pGVar31->type);
          ValidationInfo::shouldBeFalse<wasm::Name>
                    ((ValidationInfo *)local_100,bVar21,
                     (IString)*(IString *)&(pGVar31->super_Importable).super_Named,
                     "Imported global cannot be tuple",(Function *)0x0);
        }
        puVar41 = puVar41 + 1;
      } while (puVar41 != puVar3);
    }
    puVar42 = (module->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __end2._M_current =
         (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         (module->exports).
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    puVar50 = puVar42;
    if (puVar42 != (pointer)__end2._M_current) {
      do {
        pEVar4 = (puVar42->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        if (pEVar4->kind == Global) {
          pGVar31 = Module::getGlobalOrNull(module,(Name)(pEVar4->value).super_IString.str);
          if (pGVar31 != (Global *)0x0) {
            if (((module->features).features & 2) == 0) {
              ValidationInfo::shouldBeFalse<wasm::Name>
                        ((ValidationInfo *)local_100,pGVar31->mutable_,
                         (Name)(pGVar31->super_Importable).super_Named.name.super_IString.str,
                         "Exported mutable global requires mutable-globals [--enable-mutable-globals]"
                         ,(Function *)0x0);
            }
            bVar21 = wasm::Type::isTuple(&pGVar31->type);
            ValidationInfo::shouldBeFalse<wasm::Name>
                      ((ValidationInfo *)local_100,bVar21,
                       (Name)(pGVar31->super_Importable).super_Named.name.super_IString.str,
                       "Exported global cannot be tuple",(Function *)0x0);
          }
        }
        else if ((pEVar4->kind == Function) && ((byte)info.wasm == 1)) {
          pFVar28 = Module::getFunction(module,(Name)(pEVar4->value).super_IString.str);
          local_48 = (_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&pFVar28->type;
          SVar55 = HeapType::getSignature((HeapType *)local_48);
          auStack_88 = (undefined1  [8])SVar55.params.id;
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)0x0;
          type.id = (uintptr_t)auStack_88;
          pTVar25 = (Type *)wasm::Type::size((Type *)auStack_88);
          if (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent ==
              pTVar25) goto LAB_009ca01f;
          do {
            do {
              pTVar26 = wasm::Type::Iterator::operator*((Iterator *)&type);
              ValidationInfo::shouldBeUnequal<wasm::Name,wasm::Type>
                        ((ValidationInfo *)local_100,(Type)pTVar26->id,(Type)0x3,
                         (Name)(pFVar28->super_Importable).super_Named.name.super_IString.str,
                         "Exported function must not have i64 parameters",(Function *)0x0);
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)((long)&(__begin3.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent)->id + 1);
            } while (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent != pTVar25);
LAB_009ca01f:
          } while ((Type *)type.id != (Type *)auStack_88);
          SVar55 = HeapType::getSignature((HeapType *)local_48);
          auStack_88 = (undefined1  [8])SVar55.results.id;
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)0x0;
          type.id = (uintptr_t)auStack_88;
          pTVar25 = (Type *)wasm::Type::size((Type *)auStack_88);
          if (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent ==
              pTVar25) goto LAB_009ca0b5;
          do {
            do {
              pTVar26 = wasm::Type::Iterator::operator*((Iterator *)&type);
              ValidationInfo::shouldBeUnequal<wasm::Name,wasm::Type>
                        ((ValidationInfo *)local_100,(Type)pTVar26->id,(Type)0x3,
                         (Name)(pFVar28->super_Importable).super_Named.name.super_IString.str,
                         "Exported function must not have i64 results",(Function *)0x0);
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)((long)&(__begin3.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent)->id + 1);
            } while (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent != pTVar25);
LAB_009ca0b5:
          } while ((Type *)type.id != (Type *)auStack_88);
        }
        puVar42 = puVar42 + 1;
      } while (puVar42 != (pointer)__end2._M_current);
      puVar42 = (module->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      puVar50 = (module->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    type.id = (uintptr_t)local_318;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)&DAT_00000001;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    local_328._M_allocated_capacity._0_4_ = 0x3f800000;
    local_328._8_8_ = 0;
    local_318._0_8_ = (__node_base_ptr)0x0;
    if (puVar50 != puVar42) {
      do {
        pEVar4 = (puVar50->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        EVar2 = pEVar4->kind;
        if (4 < (uint)EVar2) {
          handle_unreachable("invalid ExternalKind",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                             ,0xcf0);
        }
        pNVar1 = &pEVar4->value;
        NVar19.super_IString.str = pNVar1->super_IString;
        switch(EVar2) {
        case Function:
          pFVar28 = Module::getFunctionOrNull(module,(IString)pNVar1->super_IString);
          pcVar36 = "module function exports must be found";
          break;
        case Table:
          pFVar28 = (Function *)Module::getTableOrNull(module,(IString)pNVar1->super_IString);
          pcVar36 = "module table exports must be found";
          break;
        case Memory:
          pFVar28 = (Function *)Module::getMemoryOrNull(module,(IString)pNVar1->super_IString);
          pcVar36 = "module memory exports must be found";
          break;
        case Global:
          pFVar28 = (Function *)Module::getGlobalOrNull(module,(IString)pNVar1->super_IString);
          pcVar36 = "module global exports must be found";
          break;
        case Tag:
          pFVar28 = (Function *)Module::getTagOrNull(module,(IString)pNVar1->super_IString);
          pcVar36 = "module tag exports must be found";
        }
        ValidationInfo::shouldBeTrue<wasm::Name>
                  ((ValidationInfo *)local_100,pFVar28 != (Function *)0x0,NVar19,pcVar36,
                   (Function *)0x0);
        pEVar4 = (puVar50->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        auStack_88 = *(undefined1 (*) [8])&(pEVar4->name).super_IString;
        name._M_dataplus._M_p = *(char **)((long)&(pEVar4->name).super_IString + 8);
        sVar29 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)&type,(key_type *)auStack_88);
        NVar19.super_IString.str._M_str = name._M_dataplus._M_p;
        NVar19.super_IString.str._M_len = (size_t)auStack_88;
        ValidationInfo::shouldBeFalse<wasm::Name>
                  ((ValidationInfo *)local_100,sVar29 != 0,NVar19,"module exports must be unique",
                   (Function *)0x0);
        local_120.id = (uintptr_t)&type;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_120.id,(key_type *)auStack_88,&local_120);
        puVar50 = puVar50 + 1;
      } while (puVar50 != puVar42);
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&type);
    auStack_88 = (undefined1  [8])&_Stack_58;
    name._M_dataplus._M_p = &DAT_00000001;
    name._M_string_length = 0;
    name.field_2._M_allocated_capacity = 0;
    name.field_2._8_4_ = 0x3f800000;
    _Stack_58._M_nxt = (__node_base_ptr)0x0;
    puVar39 = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
              (module->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __end2._M_current =
         (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         (module->globals).
         super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    TVar43.id = local_50.id;
    if (puVar39 != __end2._M_current) {
      do {
        pFVar28 = (puVar39->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(pFVar28->super_Importable).module + 8) == (char *)0x0) {
          local_370 = (undefined1  [8])pFVar28;
          FVar22 = wasm::Type::getFeatures((Type *)&pFVar28->type);
          ValidationInfo::shouldBeTrue<wasm::Name>
                    ((ValidationInfo *)local_100,
                     (FVar22.features & ~(module->features).features) == 0,
                     (IString)*(IString *)&(pFVar28->super_Importable).super_Named,
                     "all used types should be allowed",(Function *)0x0);
          ValidationInfo::shouldBeTrue<wasm::Name>
                    ((ValidationInfo *)local_100,
                     *(Expression **)&pFVar28->profile != (Expression *)0x0,
                     (IString)*(IString *)&(pFVar28->super_Importable).super_Named,
                     "global init must be non-null",(Function *)0x0);
          pEVar5 = *(Expression **)&pFVar28->profile;
          if (pEVar5 == (Expression *)0x0) {
            __assert_fail("curr->init",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                          ,0xd02,
                          "auto wasm::validateGlobals(Module &, ValidationInfo &)::(anonymous class)::operator()(Global *) const"
                         );
          }
          if (pEVar5->_id == TupleMakeId) {
            uVar6 = pEVar5[1].type.id;
            if (uVar6 == 0) {
              bVar21 = true;
              TVar43.id = local_50.id;
            }
            else {
              uVar37 = 0;
              do {
                if (pEVar5[1].type.id <= uVar37) {
                  __assert_fail("index < usedElements",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                                ,0xbc,
                                "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                               );
                }
                bVar21 = Properties::isValidConstantExpression
                                   (module,*(Expression **)(*(long *)(pEVar5 + 1) + uVar37 * 8));
                bVar54 = uVar6 - 1 != uVar37;
                uVar37 = uVar37 + 1;
                TVar43.id = local_50.id;
              } while (bVar21 && bVar54);
            }
          }
          else {
            bVar21 = Properties::isValidConstantExpression(module,pEVar5);
          }
          ValidationInfo::shouldBeTrue<wasm::Name>
                    ((ValidationInfo *)local_100,bVar21,
                     (IString)*(IString *)&(pFVar28->super_Importable).super_Named,
                     "global init must be constant",(Function *)0x0);
          pEVar5 = *(Expression **)&pFVar28->profile;
          bVar21 = wasm::Type::isSubType((Type)(pEVar5->type).id,(Type)((Type *)&pFVar28->type)->id)
          ;
          if (!bVar21) {
            pcVar36 = (char *)0x0;
            ValidationInfo::fail<wasm::Expression*,char_const*>
                      ((ValidationInfo *)local_100,"global init must have correct type",pEVar5,
                       (Function *)0x0);
            if (info.wasm._2_1_ == 0) {
              this_00 = ValidationInfo::getStream_abi_cxx11_
                                  ((ValidationInfo *)local_100,(Function *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"(on global ",0xb);
              name_02.super_IString.str._M_str = pcVar36;
              name_02.super_IString.str._M_len =
                   (size_t)*(char **)((long)&(pFVar28->super_Importable).super_Named + 8);
              poVar30 = wasm::operator<<((wasm *)this_00,
                                         *(ostream **)&(pFVar28->super_Importable).super_Named,
                                         name_02);
              std::__ostream_insert<char,std::char_traits<char>>(poVar30,")\n",2);
            }
          }
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)0x0;
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               (size_t)&local_328;
          local_328._M_allocated_capacity._0_4_ = local_328._M_allocated_capacity._0_4_ & 0xffffff00
          ;
          local_318._0_8_ = (__node_base_ptr)0x0;
          local_318._8_8_ = 0;
          local_258._M_nxt = (_Hash_node_base *)0x0;
          pFStack_250 = (Function *)0x0;
          local_318._176_8_ =
               (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)0x0;
          pTStack_260 = (pointer)0x0;
          local_240 = local_100;
          _Stack_238._M_buckets = &_Stack_238._M_single_bucket;
          _Stack_238._M_bucket_count = (size_type)&DAT_00000001;
          _Stack_238._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          _Stack_238._M_element_count = 0;
          _Stack_238._M_rehash_policy._M_max_load_factor = 1.0;
          _Stack_238._M_rehash_policy._M_next_resize = 0;
          _Stack_238._M_single_bucket = (__node_base_ptr)0x0;
          local_200._M_buckets = &local_200._M_single_bucket;
          local_200._M_bucket_count = 1;
          local_200._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_200._M_element_count = 0;
          local_200._M_rehash_policy._M_max_load_factor = 1.0;
          local_200._M_rehash_policy._M_next_resize = 0;
          local_200._M_single_bucket = (__node_base_ptr)0x0;
          local_1c8._M_buckets = &local_1c8._M_single_bucket;
          local_1c8._M_bucket_count = 1;
          local_1c8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_1c8._M_element_count = 0;
          local_1c8._M_rehash_policy._M_max_load_factor = 1.0;
          local_1c8._M_rehash_policy._M_next_resize = 0;
          local_1c8._M_single_bucket = (__node_base_ptr)0x0;
          local_190._M_buckets = &local_190._M_single_bucket;
          local_190._M_bucket_count = 1;
          local_190._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_190._M_element_count = 0;
          local_190._M_rehash_policy._M_max_load_factor = 1.0;
          local_190._M_rehash_policy._M_next_resize = 0;
          local_190._M_single_bucket = (__node_base_ptr)0x0;
          local_158._M_buckets = &local_158._M_single_bucket;
          local_158._M_bucket_count = 1;
          local_158._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_158._M_element_count = 0;
          local_158._M_rehash_policy._M_max_load_factor = 1.0;
          local_158._M_rehash_policy._M_next_resize = 0;
          local_158._M_single_bucket = (__node_base_ptr)0x0;
          local_120.id = *(uintptr_t *)&pFVar28->profile;
          type.id = TVar43.id;
          local_248 = module;
          Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::walk
                    ((Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      *)local_318,(Expression **)&local_120);
          type.id = TVar43.id;
          std::
          _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_158);
          std::
          _Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_190);
          std::
          _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_1c8);
          std::
          _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_200);
          std::
          _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&_Stack_238);
          if ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)local_318._176_8_ !=
              (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)0x0) {
            operator_delete((void *)local_318._176_8_,(long)local_258._M_nxt - local_318._176_8_);
          }
          type.id = (uintptr_t)info.outputs._M_h._M_single_bucket;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
              != &local_328) {
            operator_delete((void *)__begin3.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                    .index,
                            CONCAT44(local_328._M_allocated_capacity._4_4_,
                                     local_328._M_allocated_capacity._0_4_) + 1);
          }
          if ((((module->features).features & 0x400) != 0) &&
             (*(Expression **)&pFVar28->profile != (Expression *)0x0)) {
            FindAll<wasm::GlobalGet>::FindAll
                      ((FindAll<wasm::GlobalGet> *)&type,*(Expression **)&pFVar28->profile);
            pTVar25 = __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      parent;
            for (HVar51 = type; (Type *)HVar51.id != pTVar25; HVar51.id = HVar51.id + 8) {
              pGVar31 = Module::getGlobalOrNull
                                  (module,(Name)((IString *)(((Type *)HVar51.id)->id + 0x10))->str);
              if (pGVar31 == (Global *)0x0) {
                bVar21 = false;
              }
              else {
                if (*(long **)((long)auStack_88 +
                              ((ulong)pGVar31 % (ulong)name._M_dataplus._M_p) * 8) != (long *)0x0) {
                  plVar7 = (long *)**(long **)((long)auStack_88 +
                                              ((ulong)pGVar31 % (ulong)name._M_dataplus._M_p) * 8);
                  bVar21 = true;
                  pGVar8 = (Global *)plVar7[1];
                  do {
                    if (pGVar31 == pGVar8) goto LAB_009ca66f;
                    plVar7 = (long *)*plVar7;
                  } while ((plVar7 != (long *)0x0) &&
                          (pGVar8 = (Global *)plVar7[1],
                          (ulong)pGVar8 % (ulong)name._M_dataplus._M_p ==
                          (ulong)pGVar31 % (ulong)name._M_dataplus._M_p));
                }
                bVar21 = (pGVar31->super_Importable).module.super_IString.str._M_str != (char *)0x0;
              }
LAB_009ca66f:
              ValidationInfo::shouldBeTrue<wasm::Expression*>
                        ((ValidationInfo *)local_100,bVar21,*(Expression **)&pFVar28->profile,
                         "global initializer should only refer to previous globals",(Function *)0x0)
              ;
            }
            if ((void *)type.id != (void *)0x0) {
              operator_delete((void *)type.id,
                              __begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index - type.id);
            }
            type.id = (uintptr_t)auStack_88;
            std::
            _Hashtable<wasm::Global*,wasm::Global*,std::allocator<wasm::Global*>,std::__detail::_Identity,std::equal_to<wasm::Global*>,std::hash<wasm::Global*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<wasm::Global*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Global*,false>>>>
                      ((_Hashtable<wasm::Global*,wasm::Global*,std::allocator<wasm::Global*>,std::__detail::_Identity,std::equal_to<wasm::Global*>,std::hash<wasm::Global*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)type.id,local_370,&type);
            TVar43.id = local_50.id;
          }
        }
        puVar39 = puVar39 + 1;
      } while (puVar39 != __end2._M_current);
    }
    std::
    _Hashtable<wasm::Global_*,_wasm::Global_*,_std::allocator<wasm::Global_*>,_std::__detail::_Identity,_std::equal_to<wasm::Global_*>,_std::hash<wasm::Global_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Global_*,_wasm::Global_*,_std::allocator<wasm::Global_*>,_std::__detail::_Identity,_std::equal_to<wasm::Global_*>,_std::hash<wasm::Global_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)auStack_88);
    puVar48 = (module->memories).
              super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar44 = (module->memories).
              super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (8 < (ulong)((long)puVar44 - (long)puVar48)) {
      ValidationInfo::shouldBeTrue<char_const*>
                ((ValidationInfo *)local_100,(bool)((byte)((module->features).features >> 0x10) & 1)
                 ,"memory","multiple memories require multi-memories [--enable-multi-memories]",
                 (Function *)0x0);
      puVar48 = (module->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar44 = (module->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (puVar48 != puVar44) {
      do {
        pMVar32 = (puVar48->_M_t).
                  super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
        uVar37 = (pMVar32->max).addr;
        if (uVar37 != 0xffffffffffffffff) {
          ValidationInfo::shouldBeFalse<char_const*>
                    ((ValidationInfo *)local_100,uVar37 < (pMVar32->initial).addr,"memory",
                     "memory max >= initial",(Function *)0x0);
          pMVar32 = (puVar48->_M_t).
                    super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
        }
        if ((pMVar32->indexType).id == 3) {
          bVar21 = (bool)((*(byte *)((long)&(module->features).features + 1) & 8) >> 3);
          pcVar36 = "64-bit memories require memory64 [--enable-memory64]";
        }
        else {
          ValidationInfo::shouldBeTrue<char_const*>
                    ((ValidationInfo *)local_100,(pMVar32->initial).addr < 0x10001,"memory",
                     "initial memory must be <= 4GB",(Function *)0x0);
          bVar21 = (((puVar48->_M_t).
                     super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                     super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->max).addr + 1 <
                   0x10002;
          pcVar36 = "max memory must be <= 4GB, or unlimited";
        }
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_100,bVar21,"memory",pcVar36,(Function *)0x0);
        pMVar32 = (puVar48->_M_t).
                  super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
        bVar21 = true;
        if (pMVar32->shared == true) {
          bVar21 = (pMVar32->max).addr != 0xffffffffffffffff;
        }
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_100,bVar21,"memory","shared memory must have max size",
                   (Function *)0x0);
        if (((puVar48->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->shared == true) {
          ValidationInfo::shouldBeTrue<char_const*>
                    ((ValidationInfo *)local_100,(bool)((byte)(module->features).features & 1),
                     "memory","shared memory requires threads [--enable-threads]",(Function *)0x0);
        }
        puVar48 = puVar48 + 1;
      } while (puVar48 != puVar44);
    }
    puVar52 = (module->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar45._M_current =
         (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         (module->dataSegments).
         super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    iVar20._M_current = iVar45._M_current;
    if (puVar52 != (pointer)iVar45._M_current) {
      do {
        __end2._M_current = iVar20._M_current;
        pDVar9 = (puVar52->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar9->isPassive == true) {
          ValidationInfo::shouldBeTrue<wasm::Expression*>
                    ((ValidationInfo *)local_100,SUB41(((module->features).features & 0x10) >> 4,0),
                     pDVar9->offset,
                     "nonzero segment flags require bulk memory [--enable-bulk-memory]",
                     (Function *)0x0);
          pEVar5 = ((puVar52->_M_t).
                    super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                    .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->offset;
          ValidationInfo::shouldBeEqual<wasm::Expression*,wasm::Expression*>
                    ((ValidationInfo *)local_100,pEVar5,(Expression *)0x0,pEVar5,
                     "passive segment should not have an offset",(Function *)0x0);
        }
        else {
          pcVar10 = *(pointer *)
                     ((long)&(pDVar9->data).super__Vector_base<char,_std::allocator<char>_> + 8);
          lVar11 = *(long *)&(pDVar9->data).super__Vector_base<char,_std::allocator<char>_>._M_impl;
          pMVar32 = Module::getMemoryOrNull(module,(Name)(pDVar9->memory).super_IString.str);
          bVar21 = ValidationInfo::shouldBeTrue<char_const*>
                             ((ValidationInfo *)local_100,pMVar32 != (Memory *)0x0,"segment",
                              "active segment must have a valid memory name",(Function *)0x0);
          if (bVar21) {
            pEVar5 = ((puVar52->_M_t).
                      super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                      .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->offset;
            TVar43.id = (pEVar5->type).id;
            if ((pMVar32->indexType).id == 3) {
              bVar21 = ValidationInfo::shouldBeEqual<wasm::Expression*,wasm::Type>
                                 ((ValidationInfo *)local_100,TVar43,(Type)0x3,pEVar5,
                                  "segment offset should be i64",(Function *)0x0);
            }
            else {
              bVar21 = ValidationInfo::shouldBeEqual<wasm::Expression*,wasm::Type>
                                 ((ValidationInfo *)local_100,TVar43,(Type)0x2,pEVar5,
                                  "segment offset should be i32",(Function *)0x0);
            }
            if (bVar21 != false) {
              bVar21 = Properties::isValidConstantExpression
                                 (module,((puVar52->_M_t).
                                          super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                          .super__Head_base<0UL,_wasm::DataSegment_*,_false>.
                                         _M_head_impl)->offset);
              ValidationInfo::shouldBeTrue<wasm::Expression*>
                        ((ValidationInfo *)local_100,bVar21,
                         ((puVar52->_M_t).
                          super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                          .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->offset,
                         "memory segment offset should be constant",(Function *)0x0);
              TVar43.id = local_50.id;
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)0x0;
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
                   (size_t)&local_328;
              local_328._M_allocated_capacity._0_4_ =
                   local_328._M_allocated_capacity._0_4_ & 0xffffff00;
              local_318._0_8_ = (__node_base_ptr)0x0;
              local_318._8_8_ = 0;
              local_258._M_nxt = (_Hash_node_base *)0x0;
              pFStack_250 = (Function *)0x0;
              local_318._176_8_ =
                   (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)0x0;
              pTStack_260 = (pointer)0x0;
              type.id = local_50.id;
              local_240 = local_100;
              _Stack_238._M_buckets = &_Stack_238._M_single_bucket;
              _Stack_238._M_bucket_count = (size_type)&DAT_00000001;
              _Stack_238._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              _Stack_238._M_element_count = 0;
              _Stack_238._M_rehash_policy._M_max_load_factor = 1.0;
              _Stack_238._M_rehash_policy._M_next_resize = 0;
              _Stack_238._M_single_bucket = (__node_base_ptr)0x0;
              local_200._M_buckets = &local_200._M_single_bucket;
              local_200._M_bucket_count = 1;
              local_200._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              local_200._M_element_count = 0;
              local_200._M_rehash_policy._M_max_load_factor = 1.0;
              local_200._M_rehash_policy._M_next_resize = 0;
              local_200._M_single_bucket = (__node_base_ptr)0x0;
              local_1c8._M_buckets = &local_1c8._M_single_bucket;
              local_1c8._M_bucket_count = 1;
              local_1c8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              local_1c8._M_element_count = 0;
              local_1c8._M_rehash_policy._M_max_load_factor = 1.0;
              local_1c8._M_rehash_policy._M_next_resize = 0;
              local_1c8._M_single_bucket = (__node_base_ptr)0x0;
              local_190._M_buckets = &local_190._M_single_bucket;
              local_190._M_bucket_count = 1;
              local_190._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              local_190._M_element_count = 0;
              local_190._M_rehash_policy._M_max_load_factor = 1.0;
              local_190._M_rehash_policy._M_next_resize = 0;
              local_190._M_single_bucket = (__node_base_ptr)0x0;
              local_158._M_buckets = &local_158._M_single_bucket;
              local_158._M_bucket_count = 1;
              local_158._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              local_158._M_element_count = 0;
              local_158._M_rehash_policy._M_max_load_factor = 1.0;
              local_158._M_rehash_policy._M_next_resize = 0;
              local_158._M_single_bucket = (__node_base_ptr)0x0;
              auStack_88 = (undefined1  [8])
                           ((puVar52->_M_t).
                            super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                            .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->offset
              ;
              local_248 = module;
              Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::walk
                        ((Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          *)local_318,(Expression **)auStack_88);
              type.id = TVar43.id;
              std::
              _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::~_Hashtable(&local_158);
              std::
              _Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::~_Hashtable(&local_190);
              std::
              _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::~_Hashtable(&local_1c8);
              std::
              _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::~_Hashtable(&local_200);
              std::
              _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable(&_Stack_238);
              if ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_318._176_8_ !=
                  (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)0x0) {
                operator_delete((void *)local_318._176_8_,(long)local_258._M_nxt - local_318._176_8_
                               );
              }
              type.id = (uintptr_t)info.outputs._M_h._M_single_bucket;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index != &local_328) {
                operator_delete((void *)__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                        .index,
                                CONCAT44(local_328._M_allocated_capacity._4_4_,
                                         local_328._M_allocated_capacity._0_4_) + 1);
              }
              iVar45._M_current = __end2._M_current;
              if ((pMVar32->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
                pDVar9 = (puVar52->_M_t).
                         super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                         .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
                ValidationInfo::shouldBeTrue<unsigned_long>
                          ((ValidationInfo *)local_100,
                           (ulong)((long)pcVar10 - lVar11) <= (pMVar32->initial).addr << 0x10,
                           (long)*(pointer *)
                                  ((long)&(pDVar9->data).
                                          super__Vector_base<char,_std::allocator<char>_> + 8) -
                           *(long *)&(pDVar9->data).super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl,"segment size should fit in memory (initial)",
                           (Function *)0x0);
              }
            }
          }
        }
        puVar52 = puVar52 + 1;
        iVar20._M_current = __end2._M_current;
      } while (puVar52 != (pointer)iVar45._M_current);
    }
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         (size_t)&local_328;
    local_328._M_allocated_capacity._0_4_ = local_328._M_allocated_capacity._0_4_ & 0xffffff00;
    local_318._0_8_ = (__node_base_ptr)0x0;
    local_318._8_8_ = 0;
    local_318._176_8_ =
         (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *)0x0;
    pTStack_260 = (pointer)0x0;
    local_258._M_nxt = (_Hash_node_base *)0x0;
    pFStack_250 = (Function *)0x0;
    type.id = local_50.id;
    local_240 = local_100;
    _Stack_238._M_buckets = &_Stack_238._M_single_bucket;
    _Stack_238._M_bucket_count = (size_type)&DAT_00000001;
    _Stack_238._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    _Stack_238._M_element_count = 0;
    _Stack_238._M_rehash_policy._M_max_load_factor = 1.0;
    _Stack_238._M_rehash_policy._M_next_resize = 0;
    _Stack_238._M_single_bucket = (__node_base_ptr)0x0;
    local_200._M_buckets = &local_200._M_single_bucket;
    local_200._M_bucket_count = 1;
    local_200._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_200._M_element_count = 0;
    local_200._M_rehash_policy._M_max_load_factor = 1.0;
    local_200._M_rehash_policy._M_next_resize = 0;
    local_200._M_single_bucket = (__node_base_ptr)0x0;
    local_1c8._M_buckets = &local_1c8._M_single_bucket;
    local_1c8._M_bucket_count = 1;
    local_1c8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1c8._M_element_count = 0;
    local_1c8._M_rehash_policy._M_max_load_factor = 1.0;
    local_1c8._M_rehash_policy._M_next_resize = 0;
    local_1c8._M_single_bucket = (__node_base_ptr)0x0;
    local_190._M_buckets = &local_190._M_single_bucket;
    local_190._M_bucket_count = 1;
    local_190._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_190._M_element_count = 0;
    local_190._M_rehash_policy._M_max_load_factor = 1.0;
    local_190._M_rehash_policy._M_next_resize = 0;
    local_190._M_single_bucket = (__node_base_ptr)0x0;
    local_158._M_buckets = &local_158._M_single_bucket;
    local_158._M_bucket_count = 1;
    local_158._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_158._M_element_count = 0;
    local_158._M_rehash_policy._M_max_load_factor = 1.0;
    local_158._M_rehash_policy._M_next_resize = 0;
    local_158._M_single_bucket = (__node_base_ptr)0x0;
    local_248 = module;
    if (((module->features).features & 0x100) == 0) {
      ValidationInfo::shouldBeTrue<char_const*>
                ((ValidationInfo *)local_100,
                 (ulong)((long)(module->tables).
                               super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(module->tables).
                              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) < 9,"table",
                 "Only 1 table definition allowed in MVP (requires --enable-reference-types)",
                 (Function *)0x0);
      local_48 = (_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(module->tables).
                    super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if (local_48 !=
          (_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)(module->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        pp_Var12 = ((_Hashtable *)&local_48->_M_buckets)->_M_buckets;
        wasm::Type::Type((Type *)auStack_88,(HeapType)0x1,Nullable);
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_100,(undefined1  [8])pp_Var12[9] == auStack_88,"table",
                   "Only funcref is valid for table type (when reference types are disabled)",
                   (Function *)0x0);
        puVar38 = (module->elementSegments).
                  super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_390 = (module->elementSegments).
                    super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar38 != local_390) {
          do {
            ValidationInfo::shouldBeTrue<char_const*>
                      ((ValidationInfo *)local_100,
                       *(__node_base_ptr *)
                        ((long)&(((puVar38->_M_t).
                                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl
                                 )->table).super_IString + 8) ==
                       ((_Hashtable *)&local_48->_M_buckets)->_M_buckets[1],"elem",
                       "all element segments should refer to a single table in MVP.",(Function *)0x0
                      );
            pEVar13 = (puVar38->_M_t).
                      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                      .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
            ppEVar14 = *(pointer *)
                        ((long)&(pEVar13->data).
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                        + 8);
            __end2._M_current =
                 (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)puVar38;
            for (ppEVar46 = *(pointer *)
                             &(pEVar13->data).
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl; ppEVar46 != ppEVar14; ppEVar46 = ppEVar46 + 1) {
              pEVar5 = *ppEVar46;
              ValidationInfo::shouldBeTrue<wasm::Expression*>
                        ((ValidationInfo *)local_100,pEVar5->_id == RefFuncId,pEVar5,
                         "all table elements must be non-null funcrefs in MVP.",(Function *)0x0);
              auStack_88 = (undefined1  [8])pEVar5;
              Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::walk
                        ((Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          *)local_318,(Expression **)auStack_88);
            }
            puVar38 = (pointer)(__end2._M_current + 1);
          } while (puVar38 != local_390);
        }
      }
    }
    wasm::Type::Type(&local_120,(HeapType)0x0,Nullable);
    wasm::Type::Type((Type *)local_370,(HeapType)0x1,Nullable);
    puVar49 = (module->tables).
              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar15 = (module->tables).
              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar49 != puVar15) {
      do {
        pTVar33 = (puVar49->_M_t).
                  super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                  super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_100,(pTVar33->initial).addr <= (pTVar33->max).addr,
                   "table","size minimum must not be greater than maximum",(Function *)0x0);
        bVar21 = wasm::Type::isNullable
                           (&((puVar49->_M_t).
                              super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                              .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type);
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_100,bVar21,"table",
                   "Non-nullable reference types are not yet supported for tables",(Function *)0x0);
        uVar23 = (module->features).features;
        if ((uVar23 >> 10 & 1) == 0) {
          bVar21 = wasm::Type::isFunction
                             (&((puVar49->_M_t).
                                super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type);
          bVar54 = true;
          if (!bVar21) {
            bVar54 = (Function *)
                     (((puVar49->_M_t).
                       super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                       super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id ==
                     (Function *)local_120.id;
          }
          ValidationInfo::shouldBeTrue<char_const*>
                    ((ValidationInfo *)local_100,bVar54,"table",
                     "Only function reference types or externref are valid for table type (when GC is disabled)"
                     ,(Function *)0x0);
          uVar23 = (module->features).features;
        }
        if ((uVar23 >> 10 & 1) == 0) {
          pFVar28 = (Function *)
                    (((puVar49->_M_t).
                      super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                      super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                      super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id;
          ValidationInfo::shouldBeTrue<char_const*>
                    ((ValidationInfo *)local_100,
                     pFVar28 == (Function *)local_120.id || (undefined1  [8])pFVar28 == local_370,
                     "table",
                     "Only funcref and externref are valid for table type (when gc is disabled)",
                     (Function *)0x0);
        }
        puVar49 = puVar49 + 1;
      } while (puVar49 != puVar15);
    }
    puVar38 = (module->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __end2._M_current =
         (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         (module->elementSegments).
         super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar38 != (pointer)__end2._M_current) {
      do {
        bVar21 = wasm::Type::isRef(&((puVar38->_M_t).
                                     super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                     .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                    _M_head_impl)->type);
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_100,bVar21,"elem",
                   "element segment type must be of reference type.",(Function *)0x0);
        bVar21 = wasm::Type::isNullable
                           (&((puVar38->_M_t).
                              super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                             type);
        ValidationInfo::shouldBeTrue<char_const*>
                  ((ValidationInfo *)local_100,bVar21,"elem",
                   "Non-nullable reference types are not yet supported for tables",(Function *)0x0);
        pEVar13 = (puVar38->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        pcVar36 = *(char **)((long)&(pEVar13->table).super_IString + 8);
        if (pcVar36 == (char *)0x0) {
          ValidationInfo::shouldBeTrue<char_const*>
                    ((ValidationInfo *)local_100,pEVar13->offset == (Expression *)0x0,"elem",
                     "non-table segment offset should have no offset",(Function *)0x0);
        }
        else {
          name_00.super_IString.str._M_str = pcVar36;
          name_00.super_IString.str._M_len = (pEVar13->table).super_IString.str._M_len;
          pTVar33 = Module::getTableOrNull(module,name_00);
          ValidationInfo::shouldBeTrue<char_const*>
                    ((ValidationInfo *)local_100,pTVar33 != (Table *)0x0,"elem",
                     "element segment must have a valid table name",(Function *)0x0);
          ValidationInfo::shouldBeTrue<char_const*>
                    ((ValidationInfo *)local_100,
                     ((puVar38->_M_t).
                      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                      .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->offset !=
                     (Expression *)0x0,"elem","table segment offset should have an offset",
                     (Function *)0x0);
          pEVar5 = ((puVar38->_M_t).
                    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                    .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->offset;
          ValidationInfo::shouldBeEqual<wasm::Expression*,wasm::Type>
                    ((ValidationInfo *)local_100,(Type)(pEVar5->type).id,(Type)0x2,pEVar5,
                     "element segment offset should be i32",(Function *)0x0);
          bVar21 = Properties::isValidConstantExpression
                             (module,((puVar38->_M_t).
                                      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                      .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                     _M_head_impl)->offset);
          ValidationInfo::shouldBeTrue<wasm::Expression*>
                    ((ValidationInfo *)local_100,bVar21,
                     ((puVar38->_M_t).
                      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                      .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->offset,
                     "table segment offset should be constant",(Function *)0x0);
          bVar21 = wasm::Type::isSubType
                             ((Type)(((puVar38->_M_t).
                                      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                      .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                     _M_head_impl)->type).id,(Type)(pTVar33->type).id);
          ValidationInfo::shouldBeTrue<char_const*>
                    ((ValidationInfo *)local_100,bVar21,"elem",
                     "element segment type must be a subtype of the table type",(Function *)0x0);
          auStack_88 = (undefined1  [8])
                       ((puVar38->_M_t).
                        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                        .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->offset;
          Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::walk
                    ((Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      *)local_318,(Expression **)auStack_88);
        }
        pEVar13 = (puVar38->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        ppEVar14 = *(pointer *)
                    ((long)&(pEVar13->data).
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                    + 8);
        for (ppEVar46 = *(pointer *)
                         &(pEVar13->data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl; ppEVar46 != ppEVar14; ppEVar46 = ppEVar46 + 1) {
          pEVar5 = *ppEVar46;
          bVar21 = Properties::isValidConstantExpression(module,pEVar5);
          ValidationInfo::shouldBeTrue<wasm::Expression*>
                    ((ValidationInfo *)local_100,bVar21,pEVar5,
                     "element must be a constant expression",(Function *)0x0);
          bVar21 = wasm::Type::isSubType
                             ((Type)(pEVar5->type).id,
                              (Type)(((puVar38->_M_t).
                                      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                      .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                     _M_head_impl)->type).id);
          if (!bVar21) {
            ValidationInfo::fail<wasm::Expression*,char_const*>
                      ((ValidationInfo *)local_100,"element must be a subtype of the segment type",
                       pEVar5,(Function *)0x0);
          }
          auStack_88 = (undefined1  [8])pEVar5;
          Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::walk
                    ((Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      *)local_318,(Expression **)auStack_88);
        }
        puVar38 = puVar38 + 1;
      } while (puVar38 != (pointer)__end2._M_current);
    }
    type.id = local_50.id;
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_158);
    std::
    _Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_190);
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_1c8);
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_200);
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&_Stack_238);
    if ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)local_318._176_8_ !=
        (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)0x0) {
      operator_delete((void *)local_318._176_8_,(long)local_258._M_nxt - local_318._176_8_);
    }
    type.id = (uintptr_t)info.outputs._M_h._M_single_bucket;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index !=
        &local_328) {
      operator_delete((void *)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index,
                      CONCAT44(local_328._M_allocated_capacity._4_4_,
                               local_328._M_allocated_capacity._0_4_) + 1);
    }
    puVar16 = (module->tags).
              super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (puVar16 !=
        (module->tags).
        super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ValidationInfo::shouldBeTrue<wasm::Name>
                ((ValidationInfo *)local_100,SUB41(((module->features).features & 0x40) >> 6,0),
                 (IString)*(IString *)
                           &(((puVar16->_M_t).
                              super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t
                              .super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                              super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl)->
                            super_Importable).super_Named,
                 "Tags require exception-handling [--enable-exception-handling]",(Function *)0x0);
      puVar39 = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                (module->tags).
                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __end2._M_current =
           (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
           (module->tags).
           super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar39 != __end2._M_current) {
        do {
          pFVar28 = (puVar39->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          ValidationInfo::shouldBeEqual<wasm::Name,wasm::Type>
                    ((ValidationInfo *)local_100,(Type)((Type *)&pFVar28->profile)->id,(Type)0x0,
                     (IString)*(IString *)&(pFVar28->super_Importable).super_Named,
                     "Tag type\'s result type should be none",(Function *)0x0);
          bVar21 = wasm::Type::isTuple((Type *)&((puVar39->_M_t).
                                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                                 .super__Head_base<0UL,_wasm::Function_*,_false>.
                                                _M_head_impl)->type);
          if (bVar21) {
            ValidationInfo::shouldBeTrue<wasm::Name>
                      ((ValidationInfo *)local_100,
                       (bool)((byte)((module->features).features >> 9) & 1),
                       (IString)*(IString *)
                                 &(((puVar39->_M_t).
                                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                    .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->
                                  super_Importable).super_Named,
                       "Multivalue tag type requires multivalue [--enable-multivalue]",
                       (Function *)0x0);
          }
          this_01 = (Signature *)
                    &((puVar39->_M_t).
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->type;
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)0x0;
          type.id = (uintptr_t)this_01;
          pTVar25 = (Type *)wasm::Type::size((Type *)this_01);
          while ((__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                  parent != pTVar25 || ((Signature *)type.id != this_01))) {
            pTVar26 = wasm::Type::Iterator::operator*((Iterator *)&type);
            ValidationInfo::shouldBeTrue<wasm::Name>
                      ((ValidationInfo *)local_100,1 < pTVar26->id,
                       (IString)*(IString *)
                                 &(((puVar39->_M_t).
                                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                    .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->
                                  super_Importable).super_Named,
                       "Values in a tag should have concrete types",(Function *)0x0);
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)((long)&(__begin3.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent)->id + 1);
          }
          puVar39 = puVar39 + 1;
        } while (puVar39 != __end2._M_current);
      }
    }
    pcVar36 = (module->start).super_IString.str._M_str;
    if (pcVar36 != (char *)0x0) {
      name_01.super_IString.str._M_str = pcVar36;
      name_01.super_IString.str._M_len = (module->start).super_IString.str._M_len;
      pFVar28 = Module::getFunctionOrNull(module,name_01);
      bVar21 = ValidationInfo::shouldBeTrue<wasm::Name>
                         ((ValidationInfo *)local_100,pFVar28 != (Function *)0x0,
                          (Name)(module->start).super_IString.str,"start must be found",
                          (Function *)0x0);
      if (bVar21) {
        SVar55 = HeapType::getSignature(&pFVar28->type);
        ValidationInfo::shouldBeTrue<wasm::Name>
                  ((ValidationInfo *)local_100,SVar55.params.id.id == 0,
                   (Name)(module->start).super_IString.str,"start must have 0 params",
                   (Function *)0x0);
        SVar55 = HeapType::getSignature(&pFVar28->type);
        ValidationInfo::shouldBeTrue<wasm::Name>
                  ((ValidationInfo *)local_100,SVar55.results.id.id == 0,
                   (Name)(module->start).super_IString.str,"start must not return a value",
                   (Function *)0x0);
      }
    }
    FVar22.features = (module->features).features;
    if ((FVar22.features >> 10 & 1) != 0) {
      ValidationInfo::shouldBeTrue<wasm::FeatureSet>
                ((ValidationInfo *)local_100,(bool)((byte)(FVar22.features >> 8) & 1),FVar22,
                 "--enable-gc requires --enable-reference-types",(Function *)0x0);
    }
    if (info.wasm._3_1_ == 1) {
      type.id = (uintptr_t)local_318;
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)&DAT_00000001;
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
      local_328._M_allocated_capacity._0_4_ = 0x3f800000;
      local_328._8_8_ = 0;
      local_318._0_8_ = (__node_base_ptr)0x0;
      puVar47 = (module->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar17 = (module->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar47 != puVar17) {
        do {
          pFVar28 = (puVar47->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          if (*(char **)((long)&(pFVar28->super_Importable).module + 8) != (char *)0x0) {
            auStack_88 = (undefined1  [8])&type;
            std::
            _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                      ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&type,&pFVar28->type,auStack_88);
          }
          puVar47 = puVar47 + 1;
        } while (puVar47 != puVar17);
      }
      puVar42 = (module->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar50 = (module->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar42 != puVar50) {
        do {
          pEVar4 = (puVar42->_M_t).
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          if (pEVar4->kind == Function) {
            pFVar28 = Module::getFunction(module,(Name)(pEVar4->value).super_IString.str);
            auStack_88 = (undefined1  [8])&type;
            std::
            _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                      ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&type,&pFVar28->type,auStack_88);
          }
          puVar42 = puVar42 + 1;
        } while (puVar42 != puVar50);
      }
      wasm::ModuleUtils::getPublicHeapTypes(&local_388,module);
      __end2._M_current =
           (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
           local_388.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (local_388.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_388.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_48 = &(module->typeNames)._M_h;
        puVar39 = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                  local_388.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          local_350._M_head_impl =
               (puVar39->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          cVar34 = std::
                   _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)&type,(key_type *)&local_350);
          if (cVar34.super__Node_iterator_base<wasm::HeapType,_true>._M_cur == (__node_type *)0x0) {
            HeapType::toString_abi_cxx11_((string *)auStack_88,(HeapType *)&local_350);
            iVar35 = std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(local_48,(key_type *)&local_350);
            if (iVar35.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
                _M_cur != (__node_type *)0x0) {
              local_120.id = (uintptr_t)local_110;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_120,
                         *(long *)((long)iVar35.
                                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                                         ._M_cur + 0x18),
                         *(long *)((long)iVar35.
                                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                                         ._M_cur + 0x10) +
                         *(long *)((long)iVar35.
                                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                                         ._M_cur + 0x18));
              std::__cxx11::string::operator=((string *)auStack_88,(string *)&local_120);
              if ((Function *)local_120.id != (Function *)local_110) {
                operator_delete((void *)local_120.id,local_110._0_8_ + 1);
              }
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_370,"publicly exposed type disallowed with a closed world: $",
                           (string *)auStack_88);
            ValidationInfo::fail<wasm::HeapType,std::__cxx11::string>
                      ((ValidationInfo *)local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_370,(HeapType)local_350._M_head_impl,(Function *)0x0);
            if (local_370 != (undefined1  [8])&stack0xfffffffffffffca0) {
              operator_delete((void *)local_370,local_360 + 1);
            }
            if (auStack_88 != (undefined1  [8])&name._M_string_length) {
              operator_delete((void *)auStack_88,name._M_string_length + 1);
            }
          }
          puVar39 = puVar39 + 1;
        } while (puVar39 != __end2._M_current);
      }
      if ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
          local_388.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)0x0) {
        operator_delete(local_388.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_388.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_388.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&type);
    }
  }
  iVar24 = PassRunner::getPassDebug();
  if (iVar24 != 0) {
    local_318._176_8_ = &_Stack_238;
    type.id = 0;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_318._128_8_ = (pointer)0x0;
    local_318._136_8_ = (_Hash_node_base *)0x0;
    local_318._144_8_ = (pointer)0x0;
    local_318._152_8_ = (Function *)0x0;
    local_318._168_8_ = local_100;
    pTStack_260 = (pointer)&DAT_00000001;
    local_258._M_nxt = (_Hash_node_base *)0x0;
    pFStack_250 = (Function *)0x0;
    local_248 = (Module *)CONCAT44(local_248._4_4_,0x3f800000);
    local_240 = (undefined1 *)0x0;
    _Stack_238._M_buckets = (__buckets_ptr)0x0;
    puVar41 = (module->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (module->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_318._160_8_ = module;
    if (puVar41 != puVar3) {
      do {
        pGVar31 = (puVar41->_M_t).
                  super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar31->super_Importable).module + 8) == (char *)0x0) {
          Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
          walk((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                *)&type,&pGVar31->init);
        }
        puVar41 = puVar41 + 1;
      } while (puVar41 != puVar3);
    }
    puVar47 = (module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar17 = (module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar47 != puVar17) {
      do {
        pFVar28 = (puVar47->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(pFVar28->super_Importable).module + 8) == (char *)0x0) {
          local_318._152_8_ = pFVar28;
          Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
          walk((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                *)&type,&pFVar28->body);
          local_318._152_8_ = (Function *)0x0;
        }
        puVar47 = puVar47 + 1;
      } while (puVar47 != puVar17);
    }
    puVar38 = (module->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __end2._M_current =
         (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         (module->elementSegments).
         super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar38 != (pointer)__end2._M_current) {
      do {
        pEVar13 = (puVar38->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        if (*(char **)((long)&(pEVar13->table).super_IString + 8) != (char *)0x0) {
          Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
          walk((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                *)&type,&pEVar13->offset);
        }
        ppEVar14 = *(pointer *)
                    ((long)&(pEVar13->data).
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                    + 8);
        for (ppEVar46 = *(pointer *)
                         &(pEVar13->data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl; ppEVar46 != ppEVar14; ppEVar46 = ppEVar46 + 1) {
          auStack_88 = (undefined1  [8])*ppEVar46;
          Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
          walk((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                *)&type,(Expression **)auStack_88);
        }
        puVar38 = puVar38 + 1;
      } while (puVar38 != (pointer)__end2._M_current);
    }
    puVar52 = (module->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar18 = (module->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar52 != puVar18) {
      do {
        pDVar9 = (puVar52->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar9->isPassive == false) {
          Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>::
          walk((Walker<BinaryenIRValidator,_wasm::UnifiedExpressionVisitor<BinaryenIRValidator,_void>_>
                *)&type,&pDVar9->offset);
        }
        puVar52 = puVar52 + 1;
      } while (puVar52 != puVar18);
    }
    local_318._160_8_ = (Module *)0x0;
    std::
    _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)(local_318 + 0xb0));
    if ((pointer)local_318._128_8_ != (pointer)0x0) {
      operator_delete((void *)local_318._128_8_,local_318._144_8_ - local_318._128_8_);
    }
  }
  if (((info.wasm._4_1_ & 1) == 0) && (info.wasm._2_1_ == 0)) {
    puVar47 = (module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar17 = (module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar47 != puVar17) {
      do {
        ValidationInfo::getStream_abi_cxx11_
                  ((ValidationInfo *)local_100,
                   (puVar47->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(char *)type.id,
                   (long)__begin3.
                         super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent)
        ;
        if ((size_t *)type.id !=
            &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index) {
          operator_delete((void *)type.id,
                          __begin3.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                          + 1);
        }
        puVar47 = puVar47 + 1;
      } while (puVar47 != puVar17);
    }
    ValidationInfo::getStream_abi_cxx11_((ValidationInfo *)local_100,(Function *)0x0);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)type.id,
               (long)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent);
    if ((size_t *)type.id !=
        &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index) {
      operator_delete((void *)type.id,
                      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index + 1);
    }
  }
  bVar40 = info.wasm._4_1_;
  PassRunner::~PassRunner(&local_4a8);
  std::
  _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&info.mutex.super___mutex_base._M_mutex.__data.__list.__next);
  return (bool)(bVar40 & 1);
}

Assistant:

bool WasmValidator::validate(Module& module, Flags flags) {
  ValidationInfo info(module);
  info.validateWeb = (flags & Web) != 0;
  info.validateGlobally = (flags & Globally) != 0;
  info.quiet = (flags & Quiet) != 0;
  info.closedWorld = (flags & ClosedWorld) != 0;
  // parallel wasm logic validation
  PassRunner runner(&module);
  FunctionValidator(module, &info).validate(&runner);
  // validate globally
  if (info.validateGlobally) {
    validateImports(module, info);
    validateExports(module, info);
    validateGlobals(module, info);
    validateMemories(module, info);
    validateDataSegments(module, info);
    validateTables(module, info);
    validateTags(module, info);
    validateModule(module, info);
    validateFeatures(module, info);
    if (info.closedWorld) {
      validateClosedWorldInterface(module, info);
    }
  }
  // validate additional internal IR details when in pass-debug mode
  if (PassRunner::getPassDebug()) {
    validateBinaryenIR(module, info);
  }
  // print all the data
  if (!info.valid.load() && !info.quiet) {
    for (auto& func : module.functions) {
      std::cerr << info.getStream(func.get()).str();
    }
    std::cerr << info.getStream(nullptr).str();
  }
  return info.valid.load();
}